

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wifi_impl.cpp
# Opt level: O2

void __thiscall ui::anon_unknown_0::WiFiImpl::RefreshNetworkList(WiFiImpl *this)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  mapped_type *pmVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *psVar6;
  allocator<char> local_132;
  allocator<char> local_131;
  WiFiImpl *local_130;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_128;
  string *local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> unique_name;
  string name;
  string current_line;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp_start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> mac_address;
  string local_50;
  
  local_130 = this;
  bVar2 = WifiStatus(this);
  if (!bVar2) {
    shell_helper("connmanctl enable wifi");
  }
  shell_helper("connmanctl scan wifi");
  psVar1 = &local_130->result;
  shell_helper("cat /sys/class/net/wlan0/address | sed  -r \'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/\\1\\2\\3\\4\\5\\6/\'"
               ,psVar1);
  std::__cxx11::string::substr((ulong)&mac_address,(ulong)psVar1);
  shell_helper("connmanctl services | sed -e \'s/[ \t]*//\'",psVar1);
  local_120 = psVar1;
  std::operator+(&temp_start,"wifi_",&mac_address);
  local_128 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&local_130->service_names;
  psVar1 = &local_130->active_name;
  while( true ) {
    psVar6 = local_120;
    if ((local_130->result)._M_string_length == 0) break;
    lVar3 = std::__cxx11::string::find((char *)local_120,0x14b509);
    if (lVar3 != -1) {
      std::__cxx11::string::find((char *)psVar6,0x14b509);
      std::__cxx11::string::substr((ulong)&name,(ulong)psVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&unique_name," ",(allocator<char> *)&local_50);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0," \t",&local_132);
      reduce(&current_line,&name,&unique_name,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&unique_name);
      std::__cxx11::string::~string((string *)&name);
      lVar3 = std::__cxx11::string::find((string *)&current_line,(ulong)&temp_start);
      if (lVar3 != -1) {
        if (lVar3 == 0) {
          __rhs = &unique_name;
          std::__cxx11::string::substr((ulong)__rhs,(ulong)&current_line);
          std::operator+(&name,"hidden - ",__rhs);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_128,&name);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&name);
        }
        else {
          std::__cxx11::string::substr((ulong)&unique_name,(ulong)&current_line);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0," ",&local_132);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_50," \t",&local_131);
          reduce(&name,&unique_name,&local_b0,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&unique_name);
          uVar5 = std::__cxx11::string::find((char *)&name,0x148604);
          if (uVar5 != 0xffffffffffffffff) {
            std::__cxx11::string::find_first_of((char *)&name,0x147cae);
            std::__cxx11::string::erase((ulong)&name,uVar5);
            std::__cxx11::string::_M_assign((string *)psVar1);
          }
          std::__cxx11::string::substr((ulong)&unique_name,(ulong)&current_line);
          pmVar4 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[](local_128,&name);
          std::__cxx11::string::_M_assign((string *)pmVar4);
          std::__cxx11::string::~string((string *)&unique_name);
          __rhs = &name;
        }
        std::__cxx11::string::~string((string *)__rhs);
      }
      std::__cxx11::string::~string((string *)&current_line);
      psVar6 = local_120;
    }
    std::__cxx11::string::erase((ulong)psVar6,0);
  }
  std::__cxx11::string::~string((string *)&temp_start);
  std::__cxx11::string::~string((string *)&mac_address);
  return;
}

Assistant:

void RefreshNetworkList() {
    if (!WifiStatus()) {
      /* Enable wifi */
      shell_helper("connmanctl enable wifi");
    }

    /* Scan wifi */
    shell_helper("connmanctl scan wifi");

    /* Get mac address formatted into continuous string */
    shell_helper(
        "cat /sys/class/net/wlan0/address | sed  -r "
        "'s/^([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2}):([^:]{2})$/"
        "\\1\\2\\3\\4\\5\\6/'",
        &result);

    /* Get macaddress from trailing spaces */
    auto mac_address = result.substr(0, result.length() - 2);

    /* Get connman services */
    shell_helper("connmanctl services | sed -e 's/[ \t]*//'", &result);

    /* Temporary string to store wifi_macaddress*/
    auto temp_start = "wifi_" + mac_address;

    while (true) {
      if (result.length() == 0) {
        break;
      }

      /* Position of newline character */
      size_t newline_pos = 1;
      if (result.find("\n") != std::string::npos) {
        newline_pos = result.find("\n");

        /* Get current line from trimmed sub sequence */
        auto current_line = reduce(result.substr(0, newline_pos));

        /* Position of wifi_<macaddress> */
        auto pos = current_line.find(temp_start);

        /* Default check for std::string::npos */
        if (pos != std::string::npos) {
          /* pos==0 means that it is hidden and has no name*/
          if (pos != 0) {
            auto name = reduce(current_line.substr(0, pos));
            auto act_pos = name.find("*A");
            if (act_pos != std::string::npos) {
              name.erase(act_pos, act_pos + name.find_first_of(" ") + 1);
              active_name = name;
            }
            auto unique_name = current_line.substr(pos);
            service_names[name] = unique_name;
          } else {
            service_names["hidden - " + current_line.substr(0, 10)] =
                current_line;
          }
        } else {
        }
      }
      result.erase(0, newline_pos + 1);
    }
  }